

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn_dh.c
# Opt level: O2

int isobusfs_cmn_dh_validate_dir_path(char *path,_Bool writable)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  undefined7 in_register_00000031;
  stat path_stat;
  
  iVar1 = access(path,(int)CONCAT71(in_register_00000031,writable) * 2 + 4);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = -*piVar3;
    pcVar4 = "";
    if (writable) {
      pcVar4 = "and write";
    }
    pcVar2 = strerror(iVar1);
    isobusfs_log(LOG_LEVEL_ERROR,"failed to acces path %s, for read %s. %s",path,pcVar4,pcVar2);
  }
  else {
    iVar1 = stat(path,(stat *)&path_stat);
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      iVar1 = -*piVar3;
      pcVar4 = strerror(iVar1);
      isobusfs_log(LOG_LEVEL_ERROR,"failed to get stat information on path %s. %s",path,pcVar4);
    }
    else {
      iVar1 = 0;
      if ((path_stat.st_mode & 0xf000) != 0x4000) {
        isobusfs_log(LOG_LEVEL_ERROR,"path %s is not a directory",path);
        iVar1 = -0x14;
      }
    }
  }
  return iVar1;
}

Assistant:

int isobusfs_cmn_dh_validate_dir_path(const char *path, bool writable)
{
	struct stat path_stat;
	int mode = R_OK;
	int ret;

	mode |= writable ? W_OK : 0;
	ret = access(path, mode);
	if (ret == -1) {
		ret = -errno;
		pr_err("failed to acces path %s, for read %s. %s", path,
		       writable ? "and write" : "", strerror(ret));
		return ret;
	}

	ret = stat(path, &path_stat);
	if (ret == -1) {
		ret = -errno;
		pr_err("failed to get stat information on path %s. %s", path,
			strerror(ret));
		return ret;
	}

	if (!S_ISDIR(path_stat.st_mode)) {
		pr_err("path %s is not a directory", path);
		return -ENOTDIR;
	}

	return 0;
}